

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_rex_scanfn(arg_rex *parent,char *argval)

{
  undefined8 *puVar1;
  TRexBool TVar2;
  TRex *exp;
  int iVar3;
  char *error;
  char *local_28;
  
  local_28 = (char *)0x0;
  iVar3 = 2;
  if (parent->count != (parent->hdr).maxcount) {
    if (argval == (char *)0x0) {
      parent->count = parent->count + 1;
      iVar3 = 0;
    }
    else {
      puVar1 = (undefined8 *)(parent->hdr).priv;
      exp = trex_compile((char *)*puVar1,&local_28,*(int *)(puVar1 + 1));
      TVar2 = trex_match(exp,argval);
      if (TVar2 == 0) {
        iVar3 = 7;
      }
      else {
        iVar3 = parent->count;
        parent->count = iVar3 + 1;
        parent->sval[iVar3] = argval;
        iVar3 = 0;
      }
      trex_free(exp);
    }
  }
  return iVar3;
}

Assistant:

static int arg_rex_scanfn(struct arg_rex * parent, const char * argval) {
	int errorcode = 0;
	const TRexChar * error = NULL;
	TRex * rex = NULL;
	TRexBool is_match = TRex_False;

	if (parent->count == parent->hdr.maxcount ) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent argument value unaltered but still count the argument. */
		parent->count++;
	} else {
		struct privhdr * priv = (struct privhdr *)parent->hdr.priv;

		/* test the current argument value for a match with the regular expression */
		/* if a match is detected, record the argument value in the arg_rex struct */

		rex = trex_compile(priv->pattern, &error, priv->flags);
		is_match = trex_match(rex, argval);

		if (!is_match) {
			errorcode = EREGNOMATCH;
		} else {
			parent->sval[parent->count++] = argval;
		}

		trex_free(rex);
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}